

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_row.c
# Opt level: O0

void TableRow_transfer(TableRow *to_table_row,TableRow *from_table_row)

{
  TableRow *from_table_row_local;
  TableRow *to_table_row_local;
  
  to_table_row->type = from_table_row->type;
  (to_table_row->location).line = (from_table_row->location).line;
  (to_table_row->location).column = (from_table_row->location).column;
  to_table_row->id = from_table_row->id;
  from_table_row->id = (wchar_t *)0x0;
  to_table_row->table_cells = from_table_row->table_cells;
  from_table_row->table_cells = (TableCells *)0x0;
  TableRow_delete(from_table_row);
  return;
}

Assistant:

void TableRow_transfer(TableRow* to_table_row, TableRow* from_table_row) {
    to_table_row->type = from_table_row->type;
    to_table_row->location.line = from_table_row->location.line;
    to_table_row->location.column = from_table_row->location.column;
    to_table_row->id = from_table_row->id;
    from_table_row->id = 0;
    to_table_row->table_cells = from_table_row->table_cells;
    from_table_row->table_cells = 0;
    TableRow_delete(from_table_row);
}